

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRt1PalCommand::Execute(DrawColumnRt1PalCommand *this,DrawerThread *thread)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  uint8_t *puVar9;
  
  iVar5 = (this->super_PalRtCommand).yl;
  uVar3 = DrawerThread::count_for_thread(thread,iVar5,((this->super_PalRtCommand).yh - iVar5) + 1);
  if (0 < (int)uVar3) {
    puVar1 = (this->super_PalRtCommand)._colormap;
    iVar5 = (this->super_PalRtCommand).yl;
    iVar4 = DrawerThread::skipped_by_thread(thread,iVar5);
    puVar9 = (this->super_PalRtCommand)._destorg +
             (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar4 + iVar5];
    puVar2 = thread->dc_temp;
    iVar5 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    pbVar6 = puVar2 + (long)*(int *)&(this->super_PalRtCommand).super_DrawerCommand.field_0xc +
                      (long)iVar5 * 4;
    lVar7 = (long)thread->num_cores * (long)(this->super_PalRtCommand)._pitch;
    if ((uVar3 & 1) != 0) {
      *puVar9 = puVar1[*pbVar6];
      pbVar6 = pbVar6 + 4;
      puVar9 = puVar9 + lVar7;
    }
    if (uVar3 != 1) {
      lVar8 = 0;
      do {
        *puVar9 = puVar1[pbVar6[lVar8 * 8]];
        puVar9[lVar7] = puVar1[pbVar6[lVar8 * 8 + 4]];
        puVar9 = puVar9 + (int)lVar7 * 2;
        lVar8 = lVar8 + 1;
      } while (uVar3 >> 1 != (uint)lVar8);
    }
  }
  return;
}

Assistant:

void DrawColumnRt1PalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int count;
		int pitch;

		count = yh - yl + 1;

		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		colormap = _colormap;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl) *4 + hx];
		pitch = _pitch*thread->num_cores;

		if (count & 1) {
			*dest = colormap[*source];
			source += 4;
			dest += pitch;
		}
		if (!(count >>= 1))
			return;

		do {
			dest[0] = colormap[source[0]];
			dest[pitch] = colormap[source[4]];
			source += 8;
			dest += pitch*2;
		} while (--count);
	}